

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

double __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>::
ReadConstant(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
             *this,char code)

{
  double dVar1;
  BinaryReader<mp::internal::IdentityConverter> *this_00;
  double *pdVar2;
  short *psVar3;
  int *piVar4;
  int iVar5;
  undefined7 in_register_00000031;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_10;
  
  local_10.field_1.values_ = (Value *)&local_28;
  this_00 = this->reader_;
  iVar5 = (int)CONCAT71(in_register_00000031,code);
  if (iVar5 == 0x6c) {
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ =
         (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    piVar4 = (int *)BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,4);
    dVar1 = (double)*piVar4;
  }
  else if (iVar5 == 0x73) {
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ =
         (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    psVar3 = (short *)BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,2);
    dVar1 = (double)(int)*psVar3;
  }
  else {
    if (iVar5 != 0x6e) {
      local_28 = 0;
      uStack_20 = 0;
      local_10.types_ = 0;
      BinaryReaderBase::ReportError(&this_00->super_BinaryReaderBase,(CStringRef)0x261dc1,&local_10)
      ;
    }
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ =
         (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    pdVar2 = (double *)BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,8);
    dVar1 = *pdVar2;
  }
  return dVar1;
}

Assistant:

double NLReader<Reader, Handler>::ReadConstant(char code) {
  double value = 0;
  switch (code) {
  case 'n':
    value = reader_.ReadDouble();
    break;
  case 's':
    value = reader_.template ReadInt<short>();
    break;
  case 'l':
    // The following check is necessary for compatibility with ASL.
    if (sizeof(double) == 2 * sizeof(int))
      value = reader_.template ReadInt<int>();
    else
      value = reader_.template ReadInt<long>();
    break;
  default:
    reader_.ReportError("expected constant");
  }
  reader_.ReadTillEndOfLine();
  return value;
}